

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::simplify(Solver *this)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  long *plVar4;
  
  bVar3 = true;
  if ((this->levels_).super_type.ebo_.size != 0) {
    return true;
  }
  if ((this->conflict_).ebo_.size == 0) {
    uVar2 = *(uint *)&this->field_0x204;
    if ((uVar2 & 0x3fffffff) != (this->assign_).trail.ebo_.size) {
      bVar1 = simplifySAT(this);
      if (!bVar1) goto LAB_00167e4d;
      plVar4 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
      (**(code **)(*plVar4 + 0x38))(plVar4,this,uVar2 & 0x3fffffff);
      uVar2 = *(uint *)&this->field_0x204;
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      simplifySAT(this);
    }
  }
  else {
LAB_00167e4d:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Solver::simplify() {
	if (decisionLevel() != 0) return true;
	if (hasConflict())        return false;
	if (lastSimp_ != (uint32)assign_.trail.size()) {
		uint32 old = lastSimp_;
		if (!simplifySAT()) { return false; }
		assert(lastSimp_ == (uint32)assign_.trail.size());
		heuristic_->simplify(*this, old);
	}
	if (shufSimp_) { simplifySAT(); }
	return true;
}